

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

int Aig_ManCheckAcyclic_rec(Aig_Man_t *p,Aig_Obj_t *pNode,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pNode_00;
  ulong uVar4;
  char *format;
  int level;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pAVar6;
  
  if ((*(uint *)&pNode->field_0x18 & 7) == 2) {
    return 1;
  }
  pAVar6 = pNode;
  iVar1 = Aig_ObjIsConst1(pNode);
  level = (int)pAVar6;
  if (iVar1 != 0) {
    return 1;
  }
  if ((*(uint *)&pNode->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x107,"int Aig_ManCheckAcyclic_rec(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  iVar1 = p->nTravIds;
  iVar2 = iVar1 + -1;
  if (pNode->TravId == iVar2) {
    __assert_fail("!Aig_ObjIsTravIdPrevious(p, pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x109,"int Aig_ManCheckAcyclic_rec(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  if (pNode->TravId == iVar1) {
    if (fVerbose == 0) {
      return 0;
    }
    Abc_Print(level,"Network \"%s\" contains combinational loop!\n",p->pSpec);
    uVar4 = (ulong)(uint)pNode->Id;
    format = "Node \"%d\" is encountered twice on the following path to the COs:\n";
    goto LAB_004e6c1d;
  }
  pNode->TravId = iVar1;
  pAVar6 = (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe);
  if (pAVar6->TravId == iVar2) {
LAB_004e6b63:
    pAVar6 = (Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
    if (pAVar6->TravId == iVar2) {
LAB_004e6b87:
      if ((((p->pReprs == (Aig_Obj_t **)0x0) || (p->pReprs[pNode->Id] == (Aig_Obj_t *)0x0)) &&
          (ppAVar3 = p->pEquivs, ppAVar3 != (Aig_Obj_t **)0x0)) &&
         (pAVar6 = ppAVar3[pNode->Id], ppAVar3[pNode->Id] != (Aig_Obj_t *)0x0)) {
        while (pNode_00 = pAVar6, pNode_00 != (Aig_Obj_t *)0x0) {
          if (pNode_00->TravId != p->nTravIds + -1) {
            pAVar5 = p;
            iVar1 = Aig_ManCheckAcyclic_rec(p,pNode_00,fVerbose);
            level = (int)pAVar5;
            if (iVar1 == 0) {
              if (fVerbose == 0) {
                return 0;
              }
              Abc_Print(level," %d",(ulong)(uint)pNode_00->Id);
              uVar4 = (ulong)(uint)pNode->Id;
              format = " (choice of %d) -> ";
              goto LAB_004e6c1d;
            }
            ppAVar3 = p->pEquivs;
          }
          pAVar6 = (Aig_Obj_t *)0x0;
          if (ppAVar3 != (Aig_Obj_t **)0x0) {
            pAVar6 = ppAVar3[pNode_00->Id];
          }
        }
      }
      pNode->TravId = p->nTravIds + -1;
      return 1;
    }
    pAVar5 = p;
    iVar1 = Aig_ManCheckAcyclic_rec(p,pAVar6,fVerbose);
    level = (int)pAVar5;
    if (iVar1 != 0) goto LAB_004e6b87;
  }
  else {
    pAVar5 = p;
    iVar1 = Aig_ManCheckAcyclic_rec(p,pAVar6,fVerbose);
    level = (int)pAVar5;
    if (iVar1 != 0) {
      iVar2 = p->nTravIds + -1;
      goto LAB_004e6b63;
    }
  }
  if (fVerbose == 0) {
    return 0;
  }
  uVar4 = (ulong)(uint)pAVar6->Id;
  format = " %d ->";
LAB_004e6c1d:
  Abc_Print(level,format,uVar4);
  return 0;
}

Assistant:

int Aig_ManCheckAcyclic_rec( Aig_Man_t * p, Aig_Obj_t * pNode, int fVerbose )
{
    Aig_Obj_t * pFanin;
    int fAcyclic;
    if ( Aig_ObjIsCi(pNode) || Aig_ObjIsConst1(pNode) )
        return 1;
    assert( Aig_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Aig_ObjIsTravIdPrevious(p, pNode) );
    // check if the node is part of the combinational loop
    if ( Aig_ObjIsTravIdCurrent(p, pNode) )
    {
        if ( fVerbose )
            Abc_Print( 1, "Network \"%s\" contains combinational loop!\n", p->pSpec? p->pSpec : NULL );
        if ( fVerbose )
        Abc_Print( 1, "Node \"%d\" is encountered twice on the following path to the COs:\n", Aig_ObjId(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Aig_ObjSetTravIdCurrent( p, pNode );

    // visit the transitive fanin
    pFanin = Aig_ObjFanin0(pNode);
    // check if the fanin is visited
    if ( !Aig_ObjIsTravIdPrevious(p, pFanin) ) 
    {
        // traverse the fanin's cone searching for the loop
        if ( !(fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
        {
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d ->", Aig_ObjId(pFanin) );
            return 0;
        }
    }

    // visit the transitive fanin
    pFanin = Aig_ObjFanin1(pNode);
    // check if the fanin is visited
    if ( !Aig_ObjIsTravIdPrevious(p, pFanin) ) 
    {
        // traverse the fanin's cone searching for the loop
        if ( !(fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
        {
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d ->", Aig_ObjId(pFanin) );
            return 0;
        }
    }

    // visit choices
    if ( Aig_ObjRepr(p, pNode) == NULL && Aig_ObjEquiv(p, pNode) != NULL )
    {
        for ( pFanin = Aig_ObjEquiv(p, pNode); pFanin; pFanin = Aig_ObjEquiv(p, pFanin) )
        {
            // check if the fanin is visited
            if ( Aig_ObjIsTravIdPrevious(p, pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
                continue;
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d", Aig_ObjId(pFanin) );
            if ( fVerbose )
            Abc_Print( 1, " (choice of %d) -> ", Aig_ObjId(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Aig_ObjSetTravIdPrevious( p, pNode );
    return 1;
}